

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O1

int handle_timeo(long currcms)

{
  uint uVar1;
  __u8 _Var2;
  __u8 _Var3;
  __u8 _Var4;
  __u8 _Var5;
  byte bVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  size_t __n;
  long lVar11;
  canfd_frame *pcVar12;
  char *__format;
  long lVar13;
  canfd_frame *pcVar14;
  undefined8 uVar15;
  snif *psVar16;
  byte bVar17;
  
  bVar6 = clearscreen;
  bVar17 = 0;
  if (clearscreen == 0) {
    if (print_eff == '\x01') {
      uVar15 = 0x23;
      if (name_sep != '\0') {
        uVar15 = 0x2a;
      }
      __format = "%s%sXX|ms%s-- ID --%sdata ...     < %s %c l=%ld h=%ld t=%ld slots=%d >";
      pcVar8 = vdl;
    }
    else {
      uVar15 = 0x23;
      if (name_sep != '\0') {
        uVar15 = 0x2a;
      }
      __format = "%s%sXX|ms%sID %sdata ...     < %s %c l=%ld h=%ld t=%ld slots=%d >";
      pcVar8 = " | ";
    }
    printf(__format,"\x1b[2J","\x1b[H",pcVar8,pcVar8,interface,uVar15,loop,hold,timeout,
           (ulong)(uint)idx);
    clearscreen = 1;
  }
  if (notch == '\x01') {
    lVar7 = (long)idx;
    if (0 < lVar7) {
      lVar9 = 8;
      if (max_dlen != '\0') {
        lVar9 = 0x40;
      }
      lVar10 = 0x107298;
      lVar11 = 0;
      do {
        lVar13 = 0;
        do {
          *(byte *)(lVar10 + lVar13) =
               *(byte *)(lVar10 + lVar13) | *(byte *)(lVar10 + -0x48 + lVar13);
          lVar13 = lVar13 + 1;
        } while (lVar9 != lVar13);
        lVar11 = lVar11 + 1;
        lVar10 = lVar10 + 0x158;
      } while (lVar11 != lVar7);
    }
    notch = '\0';
  }
  printf("%s","\x1b[H");
  handle_timeo::frame_count = handle_timeo::frame_count + 1;
  printf("%02d\n");
  handle_timeo::frame_count = handle_timeo::frame_count % 100;
  if (0 < idx) {
    psVar16 = sniftab;
    lVar7 = 0;
    do {
      uVar1 = psVar16->flags;
      if ((uVar1 & 1) != 0) {
        if ((uVar1 & 2) != 0) {
          if ((bVar6 & (uVar1 & 4) == 0) == 0) {
            print_snifline((int)lVar7);
            psVar16->hold = hold + currcms;
            *(byte *)&psVar16->flags = (byte)psVar16->flags & 0xfb;
          }
          else if (psVar16->hold < currcms && psVar16->hold != 0) {
            __n = 8;
            if (max_dlen != '\0') {
              __n = 0x40;
            }
            memset((psVar16->marker).data,0,__n);
            print_snifline((int)lVar7);
            psVar16->hold = 0;
          }
          else {
            printf("%s","\x1b[B");
          }
          if (psVar16->timeout < currcms && psVar16->timeout != 0) {
            *(byte *)&psVar16->flags = (byte)psVar16->flags & 0xf9;
            clearscreen = 0;
          }
        }
        pcVar12 = &psVar16->current;
        pcVar14 = &psVar16->last;
        for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
          _Var2 = pcVar12->len;
          _Var3 = pcVar12->flags;
          _Var4 = pcVar12->__res0;
          _Var5 = pcVar12->__res1;
          pcVar14->can_id = pcVar12->can_id;
          pcVar14->len = _Var2;
          pcVar14->flags = _Var3;
          pcVar14->__res0 = _Var4;
          pcVar14->__res1 = _Var5;
          pcVar12 = (canfd_frame *)((long)pcVar12 + ((ulong)bVar17 * -4 + 2) * 4);
          pcVar14 = (canfd_frame *)((long)pcVar14 + ((ulong)bVar17 * -4 + 2) * 4);
        }
      }
      lVar7 = lVar7 + 1;
      psVar16 = psVar16 + 1;
    } while (lVar7 < idx);
  }
  return 1;
}

Assistant:

int handle_timeo(long currcms)
{
	int i, j;
	int force_redraw = 0;
	static unsigned int frame_count;

	if (clearscreen) {
		if (print_eff)
			printf("%s%sXX|ms%s-- ID --%sdata ...     < %s %c l=%ld h=%ld t=%ld slots=%d >",
			       CLR_SCREEN, CSR_HOME, vdl, vdl, interface, name_sep, loop, hold, timeout, idx);
		else
			printf("%s%sXX|ms%sID %sdata ...     < %s %c l=%ld h=%ld t=%ld slots=%d >",
			       CLR_SCREEN, CSR_HOME, ldl, ldl, interface, name_sep, loop, hold, timeout, idx);

		force_redraw = 1;
		clearscreen = 0;
	}

	if (notch) {
		for (i = 0; i < idx; i++) {
			for (j = 0; j < max_dlen; j++)
				sniftab[i].notch.data[j] |= sniftab[i].marker.data[j];
		}
		notch = 0;
	}

	printf("%s", CSR_HOME);
	printf("%02d\n", frame_count++); /* rolling display update counter */
	frame_count %= 100;

	for (i = 0; i < idx; i++) {
		if is_set(i, ENABLE) {
				if is_set(i, DISPLAY) {
						if (is_set(i, UPDATE) || (force_redraw)) {
							print_snifline(i);
							sniftab[i].hold = currcms + hold;
							do_clr(i, UPDATE);
						}
						else  if ((sniftab[i].hold) && (sniftab[i].hold < currcms)) {
								memset(&sniftab[i].marker.data, 0, max_dlen);
								print_snifline(i);
								sniftab[i].hold = 0; /* disable update by hold */
							}
						else
							printf("%s", CSR_DOWN); /* skip my line */

						if (sniftab[i].timeout && sniftab[i].timeout < currcms) {
							do_clr(i, DISPLAY);
							do_clr(i, UPDATE);
							clearscreen = 1; /* removed entry -> new drawing next time */
						}
					}
				sniftab[i].last      = sniftab[i].current;
			}
	}

	return 1; /* ok */
}